

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearList.cpp
# Opt level: O3

bool DeleteElem(LinearList *L,int i)

{
  int iVar1;
  ElementType *pEVar2;
  uint uVar3;
  
  if ((-1 < i) && (iVar1 = L->Last, iVar1 != 0 && i <= iVar1)) {
    uVar3 = iVar1 - 1;
    if ((uint)i < uVar3) {
      pEVar2 = L->data + (uint)i;
      do {
        *pEVar2 = pEVar2[1];
        uVar3 = L->Last - 1;
        i = i + 1;
        pEVar2 = pEVar2 + 1;
      } while (i < (int)uVar3);
    }
    L->Last = uVar3;
    return true;
  }
  return false;
}

Assistant:

bool DeleteElem(LinearList *L,int i)  //删除表中第i个结点
{
    if(i<0 || i > L->Last || L->Last==0)
        return false;  //第i个结点不存在，删除失败
    else
    {
        int j;
        for(j = i; j < L->Last-1; j++)
            L->data[j] = L->data[j+1];  //前移
        L->Last--;  //表长-1
        return true;  //删除成功
    }
}